

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O2

ActionResults * __thiscall WhiteRoomOneAction::Throw(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  string *this_01;
  itemType local_54;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == DISCUS) {
    local_54 = DISCUS;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 != BACKPACK) goto LAB_0011ee3b;
    iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != LIGHT) goto LAB_0011ee3b;
    local_54 = LADDER;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
    ItemWrapper::setLocation(pIVar3,W_ROOM1);
    this_00 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_30,
               "Good shootin\' Tex! The floor drops out in part of the room and the top of an escape ladder juts out of the newly formed hole."
               ,(allocator *)&local_54);
    ActionResults::ActionResults(this_00,CURRENT,&local_30);
    this_01 = &local_30;
LAB_0011eebf:
    std::__cxx11::string::~string((string *)this_01);
  }
  else {
LAB_0011ee3b:
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == DISCUS) {
      local_54 = DISCUS;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      if (iVar2 == BACKPACK) {
        local_54 = DISCUS;
        pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
        ItemWrapper::setLocation(pIVar3,W_ROOM1);
        this_00 = (ActionResults *)operator_new(0x30);
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "The discus floats in the air like a frisbee before crashing into a wall and rolling around on the floor."
                   ,(allocator *)&local_54);
        ActionResults::ActionResults(this_00,CURRENT,&local_50);
        this_01 = &local_50;
        goto LAB_0011eebf;
      }
    }
    this_00 = AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
  }
  return this_00;
}

Assistant:

ActionResults *WhiteRoomOneAction::Throw() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK && commands->getActedOnItem() == LIGHT){
        itemList->getValue(LADDER)->setLocation(W_ROOM1); //unhide ladder
        return new ActionResults(CURRENT, "Good shootin' Tex! The floor drops out in part of the room and the top of an escape ladder juts out of the newly formed hole.");
    }
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK) {
        itemList->getValue(DISCUS)->setLocation(W_ROOM1);
        return new ActionResults(CURRENT, "The discus floats in the air like a frisbee before crashing into a wall and rolling around on the floor.");
    }
    else {
        return AbstractRoomAction::Throw();
    }
}